

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfLogFile.c
# Opt level: O2

sbfLogFile sbfLogFile_open(char **error,char *root,char *fmt,...)

{
  char in_AL;
  int __fd;
  int iVar1;
  sbfLogFile lf;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  sbfLogFileEntry psVar5;
  undefined8 in_RCX;
  char *pcVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  stat sb;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  lf = (sbfLogFile)sbfMemory_calloc(1,0x18);
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].reg_save_area = local_e8;
  pcVar2 = sbfLogFileGetPath(root,fmt,ap);
  lf->mPath = pcVar2;
  __fd = open(pcVar2,0x40002);
  if (__fd == -1) {
    pcVar2 = lf->mPath;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    pcVar6 = "open(\"%s\") failed: %s";
LAB_00106cc3:
    sbfMemory_asprintf(error,pcVar6,pcVar2,pcVar4);
  }
  else {
    iVar1 = fstat(__fd,(stat *)&sb);
    if (iVar1 != 0) {
      pcVar2 = lf->mPath;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pcVar6 = "fstat(\"%s\") failed: %s";
      goto LAB_00106cc3;
    }
    if (sb.st_size == 0x6a3d440) {
      psVar5 = (sbfLogFileEntry)mmap((void *)0x0,0x6a3d440,1,1,__fd,0);
      lf->mBase = psVar5;
      if (psVar5 != (sbfLogFileEntry)0xffffffffffffffff) {
        lf->mNext = 0;
        goto LAB_00106ce2;
      }
      pcVar2 = lf->mPath;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pcVar6 = "mmap(\"%s\", %zu) failed: %s";
      sb.st_size = 0x6a3d440;
    }
    else {
      pcVar2 = lf->mPath;
      pcVar6 = "%s is the wrong size (size %zu, expected %zu)";
      pcVar4 = (char *)0x6a3d440;
    }
    sbfMemory_asprintf(error,pcVar6,pcVar2,sb.st_size,pcVar4);
  }
  sbfLogFile_close(lf);
  lf = (sbfLogFile)0x0;
  if (__fd == -1) {
    return (sbfLogFile)0x0;
  }
LAB_00106ce2:
  close(__fd);
  return lf;
}

Assistant:

sbfLogFile
sbfLogFile_open (char** error, const char* root, const char* fmt, ...)
{
    sbfLogFile  lf;
    va_list     ap;
    int         fd;
    size_t      size;
    struct stat sb;

    lf = xcalloc (1, sizeof *lf);

    va_start (ap, fmt);
    lf->mPath = sbfLogFileGetPath (root, fmt, ap);
    va_end (ap);

    fd = open (lf->mPath, O_RDWR|O_NOATIME);
    if (fd == -1)
    {
        xasprintf (error,
                   "open(\"%s\") failed: %s",
                   lf->mPath,
                   strerror (errno));
        goto fail;
    }

    size = sbfLogFile_size ();
    if (fstat (fd, &sb) != 0)
    {
        xasprintf (error,
                   "fstat(\"%s\") failed: %s",
                   lf->mPath,
                   strerror (errno));
        goto fail;
    }
    if (sb.st_size != (off_t)size)
    {
        xasprintf (error,
                   "%s is the wrong size (size %zu, expected %zu)",
                   lf->mPath,
                   sb.st_size,
                   size);
        goto fail;
    }

    lf->mBase = mmap (NULL, size, PROT_READ, MAP_SHARED, fd, 0);
    if (lf->mBase == MAP_FAILED)
    {
        xasprintf (error,
                   "mmap(\"%s\", %zu) failed: %s",
                   lf->mPath,
                   size,
                   strerror (errno));
        goto fail;
    }
    lf->mNext = 0;

    close (fd);

    return lf;

fail:
    sbfLogFile_close (lf);

    if (fd != -1)
        close (fd);

    return NULL;
}